

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.cpp
# Opt level: O2

void __thiscall duckdb::DBConfig::~DBConfig(DBConfig *this)

{
  ::std::unique_ptr<duckdb::IndexTypeSet,_std::default_delete<duckdb::IndexTypeSet>_>::~unique_ptr
            (&(this->index_types).
              super_unique_ptr<duckdb::IndexTypeSet,_std::default_delete<duckdb::IndexTypeSet>_>);
  ::std::unique_ptr<duckdb::CollationBinding,_std::default_delete<duckdb::CollationBinding>_>::
  ~unique_ptr(&(this->collation_bindings).
               super_unique_ptr<duckdb::CollationBinding,_std::default_delete<duckdb::CollationBinding>_>
             );
  ::std::unique_ptr<duckdb::CastFunctionSet,_std::default_delete<duckdb::CastFunctionSet>_>::
  ~unique_ptr(&(this->cast_functions).
               super_unique_ptr<duckdb::CastFunctionSet,_std::default_delete<duckdb::CastFunctionSet>_>
             );
  ::std::
  unique_ptr<duckdb::ArrowTypeExtensionSet,_std::default_delete<duckdb::ArrowTypeExtensionSet>_>::
  ~unique_ptr(&(this->arrow_extensions).
               super_unique_ptr<duckdb::ArrowTypeExtensionSet,_std::default_delete<duckdb::ArrowTypeExtensionSet>_>
             );
  ::std::unique_ptr<duckdb::EncodingFunctionSet,_std::default_delete<duckdb::EncodingFunctionSet>_>
  ::~unique_ptr(&(this->encoding_functions).
                 super_unique_ptr<duckdb::EncodingFunctionSet,_std::default_delete<duckdb::EncodingFunctionSet>_>
               );
  ::std::
  unique_ptr<duckdb::CompressionFunctionSet,_std::default_delete<duckdb::CompressionFunctionSet>_>::
  ~unique_ptr(&(this->compression_functions).
               super_unique_ptr<duckdb::CompressionFunctionSet,_std::default_delete<duckdb::CompressionFunctionSet>_>
             );
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->db_cache_entry).internal.
              super___shared_ptr<duckdb::DatabaseCacheEntry,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->encryption_util).internal.
              super___shared_ptr<duckdb::EncryptionUtil,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  ::std::
  vector<duckdb::unique_ptr<duckdb::ExtensionCallback,_std::default_delete<duckdb::ExtensionCallback>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ExtensionCallback,_std::default_delete<duckdb::ExtensionCallback>,_true>_>_>
  ::~vector(&(this->extension_callbacks).
             super_vector<duckdb::unique_ptr<duckdb::ExtensionCallback,_std::default_delete<duckdb::ExtensionCallback>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ExtensionCallback,_std::default_delete<duckdb::ExtensionCallback>,_true>_>_>
           );
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->buffer_manager).internal.
              super___shared_ptr<duckdb::BufferManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->buffer_pool).internal.
              super___shared_ptr<duckdb::BufferPool,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::StorageExtension,_std::default_delete<duckdb::StorageExtension>,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::StorageExtension,_std::default_delete<duckdb::StorageExtension>,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&(this->storage_extensions)._M_h);
  ::std::
  vector<duckdb::unique_ptr<duckdb::OperatorExtension,_std::default_delete<duckdb::OperatorExtension>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::OperatorExtension,_std::default_delete<duckdb::OperatorExtension>,_true>_>_>
  ::~vector(&(this->operator_extensions).
             super_vector<duckdb::unique_ptr<duckdb::OperatorExtension,_std::default_delete<duckdb::OperatorExtension>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::OperatorExtension,_std::default_delete<duckdb::OperatorExtension>,_true>_>_>
           );
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &(this->default_allocator).internal.
              super___shared_ptr<duckdb::Allocator,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  ::std::unique_ptr<duckdb::ErrorManager,_std::default_delete<duckdb::ErrorManager>_>::~unique_ptr
            (&(this->error_manager).
              super_unique_ptr<duckdb::ErrorManager,_std::default_delete<duckdb::ErrorManager>_>);
  ::std::vector<duckdb::OptimizerExtension,_std::allocator<duckdb::OptimizerExtension>_>::~vector
            (&(this->optimizer_extensions).
              super_vector<duckdb::OptimizerExtension,_std::allocator<duckdb::OptimizerExtension>_>)
  ;
  ::std::vector<duckdb::ParserExtension,_std::allocator<duckdb::ParserExtension>_>::~vector
            (&(this->parser_extensions).
              super_vector<duckdb::ParserExtension,_std::allocator<duckdb::ParserExtension>_>);
  DBConfigOptions::~DBConfigOptions(&this->options);
  ::std::unique_ptr<duckdb::Allocator,_std::default_delete<duckdb::Allocator>_>::~unique_ptr
            (&(this->allocator).
              super_unique_ptr<duckdb::Allocator,_std::default_delete<duckdb::Allocator>_>);
  ::std::unique_ptr<duckdb::SecretManager,_std::default_delete<duckdb::SecretManager>_>::~unique_ptr
            (&(this->secret_manager).
              super_unique_ptr<duckdb::SecretManager,_std::default_delete<duckdb::SecretManager>_>);
  std::unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>_>::~unique_ptr
            (&(this->file_system).
              super_unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>_>);
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::ExtensionOption>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::ExtensionOption>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&(this->extension_parameters)._M_h);
  ::std::vector<duckdb::ReplacementScan,_std::allocator<duckdb::ReplacementScan>_>::~vector
            (&(this->replacement_scans).
              super_vector<duckdb::ReplacementScan,_std::allocator<duckdb::ReplacementScan>_>);
  return;
}

Assistant:

DBConfig::~DBConfig() {
}